

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void __thiscall
QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->b).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->b).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->a).a.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value =
         (Type)((int)(pDVar1->super_QArrayData).ref_._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type *)&(pDVar1->super_QArrayData).ref_._q_value ==
        (__atomic_base<int>)0x0) {
      QArrayData::deallocate(&((this->a).a.d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QStringBuilder() = default;